

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O3

void printStats(Solver *solver)

{
  ulong uVar1;
  unsigned_long *puVar2;
  uint64_t uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  rusage ru;
  rusage local_b0;
  
  uVar4 = 0;
  getrusage(RUSAGE_SELF,&local_b0);
  uVar1 = solver->starts;
  if (uVar1 != 0) {
    uVar4 = solver->conflicts / uVar1;
  }
  printf("c restarts              : %lu (%lu conflicts in avg)\n",uVar1,uVar4);
  puVar2 = (solver->stats).data;
  printf("c blocked restarts      : %lu (multiple: %lu) \n",puVar2[0xf],puVar2[0x10]);
  printf("c last block at restart : %lu\n",(solver->stats).data[0x11]);
  printf("c nb ReduceDB           : %lu\n",(solver->stats).data[0xd]);
  printf("c nb removed Clauses    : %lu\n",(solver->stats).data[7]);
  printf("c nb learnts DL2        : %lu\n",(solver->stats).data[10]);
  printf("c nb learnts size 2     : %lu\n",(solver->stats).data[0xb]);
  printf("c nb learnts size 1     : %lu\n",(solver->stats).data[0xc]);
  if (solver->chanseokStrategy == true) {
    printf("c nb permanent learnts  : %lu\n",(solver->stats).data[6]);
  }
  dVar7 = (double)local_b0.ru_utime.tv_sec + (double)local_b0.ru_utime.tv_usec / 1000000.0;
  uVar3 = solver->conflicts;
  auVar5._8_4_ = (int)(uVar3 >> 0x20);
  auVar5._0_8_ = uVar3;
  auVar5._12_4_ = 0x45300000;
  printf("c conflicts             : %-12lu   (%.0f /sec)\n",
         ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) / dVar7);
  uVar1 = solver->decisions;
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  printf("c decisions             : %-12lu   (%4.2f %% random) (%.0f /sec)\n",
         (double)(((float)(solver->stats).data[0xe] * 100.0) / (float)uVar1),
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar7);
  uVar3 = solver->propagations;
  auVar6._8_4_ = (int)(uVar3 >> 0x20);
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = 0x45300000;
  printf("c propagations          : %-12lu   (%.0f /sec)\n",
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) / dVar7);
  printf("c nb reduced Clauses    : %lu\n",(solver->stats).data[9]);
  printf("c CPU time              : %g s\n",dVar7);
  return;
}

Assistant:

void printStats(Solver& solver)
{
    double cpu_time = cpuTime();
    double mem_used = 0;//memUsedPeak();
    printf("c restarts              : %" PRIu64" (%" PRIu64" conflicts in avg)\n", solver.starts,(solver.starts>0 ?solver.conflicts/solver.starts : 0));
    printf("c blocked restarts      : %" PRIu64" (multiple: %" PRIu64") \n", solver.stats[nbstopsrestarts],solver.stats[nbstopsrestartssame]);
    printf("c last block at restart : %" PRIu64"\n",solver.stats[lastblockatrestart]);
    printf("c nb ReduceDB           : %" PRIu64"\n", solver.stats[nbReduceDB]);
    printf("c nb removed Clauses    : %" PRIu64"\n",solver.stats[nbRemovedClauses]);
    printf("c nb learnts DL2        : %" PRIu64"\n", solver.stats[nbDL2]);
    printf("c nb learnts size 2     : %" PRIu64"\n", solver.stats[nbBin]);
    printf("c nb learnts size 1     : %" PRIu64"\n", solver.stats[nbUn]);
    if(solver.chanseokStrategy)
        printf("c nb permanent learnts  : %" PRIu64"\n", solver.stats[nbPermanentLearnts]);

    printf("c conflicts             : %-12" PRIu64"   (%.0f /sec)\n", solver.conflicts   , solver.conflicts   /cpu_time);
    printf("c decisions             : %-12" PRIu64"   (%4.2f %% random) (%.0f /sec)\n", solver.decisions, (float)solver.stats[rnd_decisions]*100 / (float)solver.decisions, solver.decisions   /cpu_time);
    printf("c propagations          : %-12" PRIu64"   (%.0f /sec)\n", solver.propagations, solver.propagations/cpu_time);
    //    printf("c conflict literals     : %-12" PRIu64"   (%4.2f %% deleted)\n", solver.stats[tot_literals], (solver.stats[max_literals] - solver.stats[tot_literals])*100 / (double)solver.stats[max_literals]);
    //    printf("c Average resolutions   : %-12" PRIu64"   (%.0f seen ones)\n",solver.stats[sumRes]/solver.conflicts,((double)solver.stats[sumResSeen])/solver.conflicts);
    printf("c nb reduced Clauses    : %" PRIu64"\n",solver.stats[nbReducedClauses]);

    if (mem_used != 0) printf("Memory used           : %.2f MB\n", mem_used);
    printf("c CPU time              : %g s\n", cpu_time);
}